

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O3

void __thiscall
QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished
          (QParallelAnimationGroupPrivate *this)

{
  byte bVar1;
  QObject *this_00;
  long lVar2;
  QAbstractAnimation **ppQVar3;
  int iVar4;
  int iVar5;
  QObject *pQVar6;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *d;
  ulong uVar7;
  Span *pSVar8;
  Entry *pEVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  this_00 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = QObject::sender(this_00);
  pQVar6 = QMetaObject::cast(&QAbstractAnimation::staticMetaObject,pQVar6);
  iVar4 = (*pQVar6->_vptr_QObject[0xc])(pQVar6);
  if ((iVar4 != -1) &&
     (iVar4 = QAbstractAnimation::loopCount((QAbstractAnimation *)pQVar6), -1 < iVar4))
  goto LAB_003a863f;
  d = (this->uncontrolledFinishTime).d;
  if (d == (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0) {
    d = (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0;
    uVar11 = 0;
LAB_003a8564:
    if (uVar11 == 0 && d == (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0)
    goto LAB_003a863f;
  }
  else {
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::detached(d);
      (this->uncontrolledFinishTime).d = d;
    }
    if (d->spans->offsets[0] == 0xff) {
      uVar7 = 1;
      do {
        uVar11 = uVar7;
        if (d->numBuckets == uVar11) {
          d = (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0;
          uVar11 = 0;
          break;
        }
        uVar7 = uVar11 + 1;
      } while (d->spans[uVar11 >> 7].offsets[(uint)uVar11 & 0x7f] == 0xff);
      goto LAB_003a8564;
    }
    uVar11 = 0;
  }
  iVar4 = 0;
  do {
    pSVar8 = d->spans;
    uVar7 = uVar11 >> 7;
    uVar10 = (uint)uVar11 & 0x7f;
    pEVar9 = pSVar8[uVar7].entries;
    bVar1 = pSVar8[uVar7].offsets[uVar10];
    if (*(QObject **)pEVar9[bVar1].storage.data == pQVar6) {
      iVar5 = QAbstractAnimation::currentTime((QAbstractAnimation *)pQVar6);
      pSVar8 = d->spans;
      pEVar9 = pSVar8[uVar7].entries;
      *(int *)(pEVar9[pSVar8[uVar7].offsets[uVar10]].storage.data + 8) = iVar5;
      bVar1 = pSVar8[uVar7].offsets[uVar10];
    }
    iVar4 = iVar4 + (uint)(*(int *)(pEVar9[bVar1].storage.data + 8) == -1);
    do {
      if (d->numBuckets - 1 == uVar11) {
        uVar11 = 0;
        d = (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (pSVar8[uVar11 >> 7].offsets[(uint)uVar11 & 0x7f] == 0xff);
  } while ((uVar11 != 0) || (d != (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0));
  if (iVar4 != 0) {
    return;
  }
LAB_003a863f:
  lVar2 = (this->super_QAnimationGroupPrivate).animations.d.size;
  if (lVar2 == 0) {
    iVar4 = 0;
  }
  else {
    ppQVar3 = (this->super_QAnimationGroupPrivate).animations.d.ptr;
    lVar12 = 0;
    iVar4 = 0;
    do {
      iVar5 = QAbstractAnimation::totalDuration(*(QAbstractAnimation **)((long)ppQVar3 + lVar12));
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      iVar4 = iVar5;
      lVar12 = lVar12 + 8;
    } while (lVar2 << 3 != lVar12);
  }
  if ((this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime < iVar4) {
    return;
  }
  QAbstractAnimation::stop((QAbstractAnimation *)this_00);
  return;
}

Assistant:

void QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished()
{
    Q_Q(QParallelAnimationGroup);

    QAbstractAnimation *animation = qobject_cast<QAbstractAnimation *>(q->sender());
    Q_ASSERT(animation);

    int uncontrolledRunningCount = 0;
    if (animation->duration() == -1 || animation->loopCount() < 0) {
        for (AnimationTimeHashIt it = uncontrolledFinishTime.begin(), cend = uncontrolledFinishTime.end(); it != cend; ++it) {
            if (it.key() == animation) {
                *it = animation->currentTime();
            }
            if (it.value() == -1)
                ++uncontrolledRunningCount;
        }
    }

    if (uncontrolledRunningCount > 0)
        return;

    int maxDuration = 0;
    for (AnimationListConstIt it = animations.constBegin(), cend = animations.constEnd(); it != cend; ++it)
        maxDuration = qMax(maxDuration, (*it)->totalDuration());

    if (currentTime >= maxDuration)
        q->stop();
}